

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O0

void * tdefl_write_image_to_png_file_in_memory
                 (void *pImage,int w,int h,int num_chans,size_t *pLen_out)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  tdefl_status tVar9;
  mz_bool mVar10;
  mz_ulong mVar11;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long *in_R8;
  mz_uint8 pnghdr [41];
  mz_uint32 c;
  int z;
  int y;
  int bpl;
  int i;
  tdefl_output_buffer out_buf;
  tdefl_compressor *pComp;
  tdefl_flush in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int iVar12;
  undefined1 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff69;
  undefined1 in_stack_ffffffffffffff6a;
  undefined1 in_stack_ffffffffffffff6b;
  undefined1 in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffff6d;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff71;
  undefined1 in_stack_ffffffffffffff72;
  undefined1 in_stack_ffffffffffffff73;
  mz_uint8 in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff75;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  undefined1 in_stack_ffffffffffffff78;
  undefined1 uVar13;
  undefined1 in_stack_ffffffffffffff79;
  undefined1 uVar14;
  undefined1 in_stack_ffffffffffffff7a;
  undefined1 in_stack_ffffffffffffff7b;
  undefined1 in_stack_ffffffffffffff7c;
  undefined1 uVar15;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 uVar16;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  int in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff88;
  undefined1 uVar17;
  undefined1 in_stack_ffffffffffffff89;
  undefined1 in_stack_ffffffffffffff8a;
  undefined1 in_stack_ffffffffffffff8b;
  undefined1 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8d;
  undefined1 uVar18;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 uVar19;
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 uVar20;
  int local_64;
  int local_60;
  int local_5c;
  int local_54;
  long local_50;
  long local_48;
  void *local_40;
  undefined4 local_38;
  void *local_30;
  long *local_28;
  int local_1c;
  int local_18;
  int local_14;
  void *local_8;
  
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_30 = crnlib::crnlib_malloc(0x15c216);
  local_1c = local_14 * local_1c;
  *local_28 = 0;
  if (local_30 == (void *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    memset(&local_50,0,0x20);
    local_38 = 1;
    if ((local_1c + 1) * local_18 < 0x40) {
      iVar12 = 0x40;
    }
    else {
      iVar12 = (local_1c + 1) * local_18;
    }
    local_48 = (long)(iVar12 + 0x39);
    local_40 = crnlib::crnlib_malloc(0x15c2bd);
    if (local_40 == (void *)0x0) {
      crnlib::crnlib_free((void *)0x15c2d6);
      local_8 = (void *)0x0;
    }
    else {
      for (local_60 = 0x29; local_60 != 0; local_60 = local_60 + -1) {
        tdefl_output_buffer_putter
                  ((void *)CONCAT17(in_stack_ffffffffffffff8f,
                                    CONCAT16(in_stack_ffffffffffffff8e,
                                             CONCAT15(in_stack_ffffffffffffff8d,
                                                      CONCAT14(in_stack_ffffffffffffff8c,
                                                               CONCAT13(in_stack_ffffffffffffff8b,
                                                                        CONCAT12(
                                                  in_stack_ffffffffffffff8a,
                                                  CONCAT11(in_stack_ffffffffffffff89,
                                                           in_stack_ffffffffffffff88))))))),
                   in_stack_ffffffffffffff84,
                   (void *)CONCAT17(in_stack_ffffffffffffff7f,
                                    CONCAT16(in_stack_ffffffffffffff7e,
                                             CONCAT15(in_stack_ffffffffffffff7d,
                                                      CONCAT14(in_stack_ffffffffffffff7c,
                                                               CONCAT13(in_stack_ffffffffffffff7b,
                                                                        CONCAT12(
                                                  in_stack_ffffffffffffff7a,
                                                  CONCAT11(in_stack_ffffffffffffff79,
                                                           in_stack_ffffffffffffff78))))))));
      }
      tdefl_init((tdefl_compressor *)
                 CONCAT17(in_stack_ffffffffffffff77,
                          CONCAT16(in_stack_ffffffffffffff76,
                                   CONCAT15(in_stack_ffffffffffffff75,
                                            CONCAT14(in_stack_ffffffffffffff74,
                                                     CONCAT13(in_stack_ffffffffffffff73,
                                                              CONCAT12(in_stack_ffffffffffffff72,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffff71,
                                                  in_stack_ffffffffffffff70))))))),
                 (tdefl_put_buf_func_ptr)
                 CONCAT17(in_stack_ffffffffffffff6f,
                          CONCAT16(in_stack_ffffffffffffff6e,
                                   CONCAT15(in_stack_ffffffffffffff6d,
                                            CONCAT14(in_stack_ffffffffffffff6c,
                                                     CONCAT13(in_stack_ffffffffffffff6b,
                                                              CONCAT12(in_stack_ffffffffffffff6a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),
                 (void *)CONCAT44(iVar12,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5c);
      for (local_5c = 0; local_5c < local_18; local_5c = local_5c + 1) {
        tdefl_compress_buffer
                  ((tdefl_compressor *)
                   CONCAT17(in_stack_ffffffffffffff77,
                            CONCAT16(in_stack_ffffffffffffff76,
                                     CONCAT15(in_stack_ffffffffffffff75,
                                              CONCAT14(in_stack_ffffffffffffff74,
                                                       CONCAT13(in_stack_ffffffffffffff73,
                                                                CONCAT12(in_stack_ffffffffffffff72,
                                                                         CONCAT11(
                                                  in_stack_ffffffffffffff71,
                                                  in_stack_ffffffffffffff70))))))),
                   (void *)CONCAT17(in_stack_ffffffffffffff6f,
                                    CONCAT16(in_stack_ffffffffffffff6e,
                                             CONCAT15(in_stack_ffffffffffffff6d,
                                                      CONCAT14(in_stack_ffffffffffffff6c,
                                                               CONCAT13(in_stack_ffffffffffffff6b,
                                                                        CONCAT12(
                                                  in_stack_ffffffffffffff6a,
                                                  CONCAT11(in_stack_ffffffffffffff69,
                                                           in_stack_ffffffffffffff68))))))),
                   CONCAT44(iVar12,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5c);
        tdefl_compress_buffer
                  ((tdefl_compressor *)
                   CONCAT17(in_stack_ffffffffffffff77,
                            CONCAT16(in_stack_ffffffffffffff76,
                                     CONCAT15(in_stack_ffffffffffffff75,
                                              CONCAT14(in_stack_ffffffffffffff74,
                                                       CONCAT13(in_stack_ffffffffffffff73,
                                                                CONCAT12(in_stack_ffffffffffffff72,
                                                                         CONCAT11(
                                                  in_stack_ffffffffffffff71,
                                                  in_stack_ffffffffffffff70))))))),
                   (void *)CONCAT17(in_stack_ffffffffffffff6f,
                                    CONCAT16(in_stack_ffffffffffffff6e,
                                             CONCAT15(in_stack_ffffffffffffff6d,
                                                      CONCAT14(in_stack_ffffffffffffff6c,
                                                               CONCAT13(in_stack_ffffffffffffff6b,
                                                                        CONCAT12(
                                                  in_stack_ffffffffffffff6a,
                                                  CONCAT11(in_stack_ffffffffffffff69,
                                                           in_stack_ffffffffffffff68))))))),
                   CONCAT44(iVar12,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5c);
      }
      tVar9 = tdefl_compress_buffer
                        ((tdefl_compressor *)
                         CONCAT17(in_stack_ffffffffffffff77,
                                  CONCAT16(in_stack_ffffffffffffff76,
                                           CONCAT15(in_stack_ffffffffffffff75,
                                                    CONCAT14(in_stack_ffffffffffffff74,
                                                             CONCAT13(in_stack_ffffffffffffff73,
                                                                      CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))),
                         (void *)CONCAT17(in_stack_ffffffffffffff6f,
                                          CONCAT16(in_stack_ffffffffffffff6e,
                                                   CONCAT15(in_stack_ffffffffffffff6d,
                                                            CONCAT14(in_stack_ffffffffffffff6c,
                                                                     CONCAT13(
                                                  in_stack_ffffffffffffff6b,
                                                  CONCAT12(in_stack_ffffffffffffff6a,
                                                           CONCAT11(in_stack_ffffffffffffff69,
                                                                    in_stack_ffffffffffffff68)))))))
                         ,CONCAT44(iVar12,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5c);
      if (tVar9 == TDEFL_STATUS_DONE) {
        *local_28 = local_50 + -0x29;
        uVar13 = 0;
        uVar14 = 0;
        uVar1 = (undefined1)((ushort)(undefined2)local_14 >> 8);
        uVar2 = (undefined1)(undefined2)local_14;
        uVar15 = 0;
        uVar16 = 0;
        uVar3 = (undefined1)((uint)local_18 >> 8);
        uVar4 = (undefined1)local_18;
        iVar12 = 0;
        uVar17 = 0;
        uVar5 = (undefined1)((ulong)*local_28 >> 0x18);
        uVar6 = (undefined1)((ulong)*local_28 >> 0x10);
        uVar7 = (undefined1)((ulong)*local_28 >> 8);
        uVar8 = (undefined1)*local_28;
        uVar18 = 0x49;
        uVar19 = 0x44;
        uVar20 = 0x41;
        mVar11 = mz_crc32(0,&stack0xffffffffffffff74,0x11);
        local_64 = (int)mVar11;
        for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
          (&stack0xffffffffffffff85)[local_54] = (char)((uint)local_64 >> 0x18);
          local_64 = local_64 << 8;
        }
        memcpy(local_40,&stack0xffffffffffffff68,0x29);
        mVar10 = tdefl_output_buffer_putter
                           ((void *)CONCAT17(uVar20,CONCAT16(uVar19,CONCAT15(uVar18,CONCAT14(uVar8,
                                                  CONCAT13(uVar7,CONCAT12(uVar6,CONCAT11(uVar5,
                                                  uVar17))))))),iVar12,
                            (void *)CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(uVar16,CONCAT14(uVar15,
                                                  CONCAT13(uVar2,CONCAT12(uVar1,CONCAT11(uVar14,
                                                  uVar13))))))));
        if (mVar10 == 0) {
          *local_28 = 0;
          crnlib::crnlib_free((void *)0x15c5b1);
          crnlib::crnlib_free((void *)0x15c5bb);
          local_8 = (void *)0x0;
        }
        else {
          mVar11 = mz_crc32(0,(mz_uint8 *)((long)local_40 + 0x25),*local_28 + 4);
          local_64 = (int)mVar11;
          for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
            *(char *)((long)local_40 + (long)local_54 + local_50 + -0x10) =
                 (char)((uint)local_64 >> 0x18);
            local_64 = local_64 << 8;
          }
          *local_28 = *local_28 + 0x39;
          crnlib::crnlib_free((void *)0x15c654);
          local_8 = local_40;
        }
      }
      else {
        crnlib::crnlib_free((void *)0x15c3b6);
        crnlib::crnlib_free((void *)0x15c3c0);
        local_8 = (void *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

void* tdefl_write_image_to_png_file_in_memory(const void* pImage, int w, int h, int num_chans, size_t* pLen_out) {
  tdefl_compressor* pComp = (tdefl_compressor*)MZ_MALLOC(sizeof(tdefl_compressor));
  tdefl_output_buffer out_buf;
  int i, bpl = w * num_chans, y, z;
  mz_uint32 c;
  *pLen_out = 0;
  if (!pComp)
    return NULL;
  MZ_CLEAR_OBJ(out_buf);
  out_buf.m_expandable = MZ_TRUE;
  out_buf.m_capacity = 57 + MZ_MAX(64, (1 + bpl) * h);
  if (NULL == (out_buf.m_pBuf = (mz_uint8*)MZ_MALLOC(out_buf.m_capacity))) {
    MZ_FREE(pComp);
    return NULL;
  }
  // write dummy header
  for (z = 41; z; --z)
    tdefl_output_buffer_putter(&z, 1, &out_buf);
  // compress image data
  tdefl_init(pComp, tdefl_output_buffer_putter, &out_buf, TDEFL_DEFAULT_MAX_PROBES | TDEFL_WRITE_ZLIB_HEADER);
  for (y = 0; y < h; ++y) {
    tdefl_compress_buffer(pComp, &z, 1, TDEFL_NO_FLUSH);
    tdefl_compress_buffer(pComp, (mz_uint8*)pImage + y * bpl, bpl, TDEFL_NO_FLUSH);
  }
  if (tdefl_compress_buffer(pComp, NULL, 0, TDEFL_FINISH) != TDEFL_STATUS_DONE) {
    MZ_FREE(pComp);
    MZ_FREE(out_buf.m_pBuf);
    return NULL;
  }
  // write real header
  *pLen_out = out_buf.m_size - 41;
  {
    mz_uint8 pnghdr[41] = {0x89, 0x50, 0x4e, 0x47, 0x0d, 0x0a, 0x1a, 0x0a, 0x00, 0x00, 0x00, 0x0d, 0x49, 0x48, 0x44, 0x52,
                           0, 0, (mz_uint8)(w >> 8), (mz_uint8)w, 0, 0, (mz_uint8)(h >> 8), (mz_uint8)h, 8, (mz_uint8)"\0\0\04\02\06"[num_chans], 0, 0, 0, 0, 0, 0, 0,
                           (mz_uint8)(*pLen_out >> 24), (mz_uint8)(*pLen_out >> 16), (mz_uint8)(*pLen_out >> 8), (mz_uint8)*pLen_out, 0x49, 0x44, 0x41, 0x54};
    c = (mz_uint32)mz_crc32(MZ_CRC32_INIT, pnghdr + 12, 17);
    for (i = 0; i < 4; ++i, c <<= 8)
      ((mz_uint8*)(pnghdr + 29))[i] = (mz_uint8)(c >> 24);
    memcpy(out_buf.m_pBuf, pnghdr, 41);
  }
  // write footer (IDAT CRC-32, followed by IEND chunk)
  if (!tdefl_output_buffer_putter("\0\0\0\0\0\0\0\0\x49\x45\x4e\x44\xae\x42\x60\x82", 16, &out_buf)) {
    *pLen_out = 0;
    MZ_FREE(pComp);
    MZ_FREE(out_buf.m_pBuf);
    return NULL;
  }
  c = (mz_uint32)mz_crc32(MZ_CRC32_INIT, out_buf.m_pBuf + 41 - 4, *pLen_out + 4);
  for (i = 0; i < 4; ++i, c <<= 8)
    (out_buf.m_pBuf + out_buf.m_size - 16)[i] = (mz_uint8)(c >> 24);
  // compute final size of file, grab compressed data buffer and return
  *pLen_out += 57;
  MZ_FREE(pComp);
  return out_buf.m_pBuf;
}